

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiQuery.cpp
# Opt level: O0

void __thiscall
MultiQuery<dto::Complex,_dto::Complex>::on_input
          (MultiQuery<dto::Complex,_dto::Complex> *this,Poll *p)

{
  string *packet;
  int __fd;
  bool bVar1;
  uint16_t uVar2;
  void *__buf;
  size_t __n;
  ssize_t sVar3;
  Error *this_00;
  ostream *poVar4;
  char *pcVar5;
  uint16_t port;
  char *s;
  Error *e;
  undefined1 local_90 [8];
  Complex dto;
  string data;
  socklen_t local_1c;
  int read;
  socklen_t remln;
  Poll *p_local;
  MultiQuery<dto::Complex,_dto::Complex> *this_local;
  
  local_1c = 0x10;
  __fd = (this->super_Subscriber).fd;
  _read = p;
  p_local = (Poll *)this;
  __buf = (void *)std::__cxx11::string::operator[](0x1ee780);
  __n = std::__cxx11::string::size();
  sVar3 = recvfrom(__fd,__buf,__n,0,(sockaddr *)&this->remote,&local_1c);
  if (-1 < (int)sVar3) {
    packet = (string *)(&dto.payload.field_2._M_allocated_capacity + 1);
    std::__cxx11::string::substr((ulong)packet,0x1ee780);
    ::dto::Complex::Complex((Complex *)local_90);
    ::dto::unmarshall_facade<dto::Complex>((Complex *)&e,packet);
    ::dto::Complex::operator=((Complex *)local_90,(Complex *)&e);
    ::dto::Complex::~Complex((Complex *)&e);
    poVar4 = std::operator<<((ostream *)&std::cout,"MultiQuery: received ");
    poVar4 = operator<<(poVar4,(Complex *)local_90);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    if (dto.header.cmd._2_8_ == (this->req).header.cmd_seq) {
      bVar1 = std::function::operator_cast_to_bool((function *)&this->callback);
      if (bVar1) {
        std::function<void_(dto::Complex_&,_sockaddr_in)>::operator()
                  (&this->callback,(Complex *)local_90,this->remote);
      }
    }
    else {
      pcVar5 = inet_ntoa((in_addr)(this->remote).sin_addr.s_addr);
      uVar2 = ntohs((this->remote).sin_port);
      poVar4 = std::operator<<((ostream *)&std::cout,"[PCKG ERROR] Skipping invalid package from ");
      poVar4 = std::operator<<(poVar4,pcVar5);
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar2);
      poVar4 = std::operator<<(poVar4,". ");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    ::dto::Complex::~Complex((Complex *)local_90);
    std::__cxx11::string::~string((string *)(dto.payload.field_2._M_local_buf + 8));
    return;
  }
  this_00 = (Error *)__cxa_allocate_exception(0x3f0);
  Error::Error(this_00,"Invalid read udp packet");
  __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
}

Assistant:

void MultiQuery<REQ, RES>::on_input(Poll &p) {
  socklen_t remln = sizeof(remote);
  int read = recvfrom(fd, &buffer[0], buffer.size(), 0, (struct sockaddr *) &remote, &remln);
  if (read < 0) {
    throw Error("Invalid read udp packet");
  }
  std::string data = buffer.substr(0, read);
  RES dto;
  try {
    dto = dto::unmarshall_facade<RES>(data);
  } catch (Error &e) {
    if (this->error)
      this->error();
    return;
  }
  std::cout << "MultiQuery: received " << dto << std::endl;
  if (dto.header.cmd_seq != this->req.header.cmd_seq) {
    char *s = inet_ntoa(remote.sin_addr);
    uint16_t port = ntohs(remote.sin_port);
    std::cout << "[PCKG ERROR] Skipping invalid package from " << s << ":" << port << ". " << std::endl;
  } else {
    if (this->callback)
      this->callback(dto, remote);
  }
}